

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cpp
# Opt level: O1

void __thiscall slang::Diagnostics::sort(Diagnostics *this,SourceManager *sourceManager)

{
  Diagnostic *__seed;
  size_type sVar1;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  identity local_39;
  SourceManager *local_38;
  _Temporary_buffer<slang::Diagnostic_*,_slang::Diagnostic> local_30;
  
  __seed = (this->super_SmallVector<slang::Diagnostic,_2UL>).
           super_SmallVectorBase<slang::Diagnostic>.data_;
  sVar1 = (this->super_SmallVector<slang::Diagnostic,_2UL>).super_SmallVectorBase<slang::Diagnostic>
          .len;
  if (sVar1 != 0) {
    local_38 = sourceManager;
    std::_Temporary_buffer<slang::Diagnostic_*,_slang::Diagnostic>::_Temporary_buffer
              (&local_30,__seed,(long)((sVar1 - ((long)(sVar1 + 1) >> 0x3f)) + 1) >> 1);
    if (local_30._M_buffer == (Diagnostic *)0x0) {
      __comp_00._M_comp.__proj = &local_39;
      __comp_00._M_comp.__comp = (anon_class_1_0_00000001 *)&local_38;
      std::
      __inplace_stable_sort<slang::Diagnostic*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::Diagnostics::sort(slang::SourceManager_const&)::__0,std::identity>(slang::Diagnostics::sort(slang::SourceManager_const&)::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__seed,__seed + sVar1,__comp_00);
    }
    else {
      __comp._M_comp.__proj = &local_39;
      __comp._M_comp.__comp = (anon_class_1_0_00000001 *)&local_38;
      std::
      __stable_sort_adaptive<slang::Diagnostic*,slang::Diagnostic*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::Diagnostics::sort(slang::SourceManager_const&)::__0,std::identity>(slang::Diagnostics::sort(slang::SourceManager_const&)::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__seed,__seed + sVar1,local_30._M_buffer,local_30._M_len,__comp);
    }
    std::_Temporary_buffer<slang::Diagnostic_*,_slang::Diagnostic>::~_Temporary_buffer(&local_30);
  }
  return;
}

Assistant:

Diagnostic& Diagnostic::operator<<(std::string_view arg) {
    SLANG_ASSERT(!arg.empty());
    args.emplace_back(std::string(arg));
    return *this;
}